

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.h
# Opt level: O1

bool __thiscall
ShortestVectorFirstComparator::operator()
          (ShortestVectorFirstComparator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *a,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *b)

{
  long lVar1;
  strong_ordering sVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (long)(a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar5 = (long)(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  bVar3 = true;
  if (uVar5 <= uVar4) {
    if (uVar5 < uVar4) {
      bVar3 = false;
    }
    else {
      sVar2 = std::
              lexicographical_compare_three_way<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Synth3way>
                        ();
      bVar3 = (bool)((byte)sVar2._M_value >> 7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const std::vector<unsigned char>& a, const std::vector<unsigned char>& b) const
    {
        if (a.size() < b.size()) return true;
        if (a.size() > b.size()) return false;
        return a < b;
    }